

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

int icu_63::init(EVP_PKEY_CTX *ctx)

{
  UBool UVar1;
  int iVar2;
  int extraout_EAX;
  char *str1;
  bool includeTentativeEra;
  
  if (*(int *)ctx < 1) {
    if ((gJapaneseEraRulesInitOnce.fState.super___atomic_base<int>._M_i == 2) ||
       (UVar1 = umtx_initImplPreInit(&gJapaneseEraRulesInitOnce), UVar1 == '\0')) {
      if (U_ZERO_ERROR < gJapaneseEraRulesInitOnce.fErrCode) {
        *(UErrorCode *)ctx = gJapaneseEraRulesInitOnce.fErrCode;
      }
    }
    else {
      str1 = getenv("ICU_ENABLE_TENTATIVE_ERA");
      if (str1 == (char *)0x0) {
        includeTentativeEra = false;
      }
      else {
        iVar2 = uprv_stricmp_63(str1,"true");
        includeTentativeEra = iVar2 == 0;
      }
      gJapaneseEraRules = EraRules::createInstance("japanese",includeTentativeEra,(UErrorCode *)ctx)
      ;
      gJapaneseEraRulesInitOnce.fErrCode = *(UErrorCode *)ctx;
      if (gJapaneseEraRulesInitOnce.fErrCode < U_ILLEGAL_ARGUMENT_ERROR) {
        gCurrentEra = gJapaneseEraRules->currentEra;
      }
      umtx_initImplPostInit(&gJapaneseEraRulesInitOnce);
    }
  }
  ucln_i18n_registerCleanup_63(UCLN_I18N_JAPANESE_CALENDAR,japanese_calendar_cleanup);
  return extraout_EAX;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }